

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-png.cxx
# Opt level: O2

void testSaveLoad<(andres::CoordinateOrder)0,(andres::CoordinateOrder)1>(void)

{
  reference puVar1;
  size_t sVar2;
  bool local_88 [6];
  allocator_type local_82;
  uchar local_81;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> m;
  size_t shape [2];
  string fileName;
  
  shape[0] = 2;
  shape[1] = 3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fileName,"test.png",(allocator<char> *)&m);
  local_81 = '\0';
  local_88[0] = false;
  local_88[1] = false;
  local_88[2] = false;
  local_88[3] = false;
  andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
            ((Marray<unsigned_char,std::allocator<unsigned_long>> *)&m,shape,
             (unsigned_long *)&fileName,&local_81,(CoordinateOrder *)local_88,&local_82);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&m,0,0);
  *puVar1 = '\x7f';
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&m,0,2);
  *puVar1 = 0xff;
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&m,1,0);
  *puVar1 = 200;
  andres::png::save<unsigned_char>(&fileName,&m);
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray(&m);
  local_81 = '\0';
  local_88[0] = true;
  local_88[1] = false;
  local_88[2] = false;
  local_88[3] = false;
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::Marray
            (&m,&local_81,(CoordinateOrder *)local_88,&local_82);
  andres::png::load<unsigned_char>(&fileName,&m);
  andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&m.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
  local_88[0] = m.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.geometry_.
                coordinateOrder_ == LastMajorOrder;
  test(local_88);
  sVar2 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                    (&m.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
  local_88[0] = sVar2 == 2;
  test(local_88);
  sVar2 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,0);
  local_88[0] = sVar2 == shape[0];
  test(local_88);
  sVar2 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,1);
  local_88[0] = sVar2 == shape[1];
  test(local_88);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&m,0,0);
  local_88[0] = *puVar1 == '\x7f';
  test(local_88);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&m,0,2);
  local_88[0] = *puVar1 == 0xff;
  test(local_88);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&m,1,0);
  local_88[0] = *puVar1 == 200;
  test(local_88);
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::__cxx11::string::~string((string *)&fileName);
  return;
}

Assistant:

void testSaveLoad() {
    size_t const shape[] = {2, 3};
    std::string const fileName = "test.png";
    {
        andres::Marray<unsigned char> m(shape, shape + 2, 0, ORDER_SAVE);
        m(0, 0) = 127;
        m(0, 2) = 255;
        m(1, 0) = 200;
        andres::png::save(fileName, m);
    }
    {
        andres::Marray<unsigned char> m(0, ORDER_LOAD);
        andres::png::load(fileName, m);
        test(m.coordinateOrder() == ORDER_LOAD);
        test(m.dimension() == 2);
        test(m.shape(0) == shape[0]);
        test(m.shape(1) == shape[1]);
        test(m(0, 0) == 127);
        test(m(0, 2) == 255);
        test(m(1, 0) == 200);
    }
}